

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

Vec_Int_t * Mf_ManDeriveCnfs(Mf_Man_t *p,int *pnVars,int *pnClas,int *pnLits)

{
  Vec_Mem_t *pVVar1;
  word wVar2;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  uint uVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Gia_Man_t *pGVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  size_t __size;
  ulong uVar13;
  ulong uVar14;
  Mf_Man_t *pMVar15;
  int Entry;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  int pCnf [512];
  uint local_88c;
  void *local_888;
  int local_87c;
  int *local_878;
  int *local_870;
  int *local_868;
  ulong local_860;
  Mf_Man_t *local_858;
  ulong local_850;
  void *local_848;
  int *local_840;
  uint local_838 [514];
  
  uVar12 = (p->vCnfSizes).nSize;
  uVar14 = (ulong)uVar12;
  uVar8 = 0x10;
  if (0xe < uVar12 - 1) {
    uVar8 = uVar12;
  }
  local_878 = pnLits;
  local_870 = pnClas;
  local_868 = pnVars;
  if (uVar8 == 0) {
    local_888 = (void *)0x0;
  }
  else {
    local_888 = malloc((long)(int)uVar8 << 2);
  }
  if (local_888 != (void *)0x0) {
    memset(local_888,0,(long)(int)uVar12 * 4);
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < uVar12 * 3 - 1) {
    iVar9 = uVar12 * 3;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar9;
  if (iVar9 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar9 << 2);
  }
  p_00->pArray = piVar6;
  if (iVar9 < (int)uVar12) {
    __size = (long)(int)uVar12 << 2;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(__size);
    }
    else {
      piVar6 = (int *)realloc(piVar6,__size);
    }
    p_00->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar12;
  }
  if (0 < (int)uVar12) {
    memset(p_00->pArray,0xff,uVar14 * 4);
  }
  p_00->nSize = uVar12;
  if (8 < p->pPars->nLutSize) {
    __assert_fail("p->pPars->nLutSize <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                  ,0x114,"Vec_Int_t *Mf_ManDeriveCnfs(Mf_Man_t *, int *, int *, int *)");
  }
  uVar13 = 0;
  uVar17 = 0;
  local_860 = uVar14;
  local_858 = p;
  if (0 < (int)uVar12) {
    uVar17 = (ulong)uVar12;
  }
  do {
    uVar12 = (uint)uVar13;
    if (local_858->pPars->nLutSize < 7) {
      pVVar1 = local_858->vTtMem;
      if ((long)pVVar1->nEntries <= (long)uVar13) goto LAB_00770401;
      wVar2 = pVVar1->ppPages[uVar12 >> ((byte)pVVar1->LogPageSze & 0x1f)]
              [(long)(int)(pVVar1->PageMask & uVar12) * (long)pVVar1->nEntrySize];
      local_88c = 0;
      Abc_Tt6IsopCover(wVar2,wVar2,uVar12,(int *)local_838,(int *)&local_88c);
      if ((long)(int)local_88c < 1) {
        uVar16 = 0;
      }
      else {
        uVar16 = 0;
        do {
          local_838[uVar16] = local_838[uVar16] | 1 << ((char)uVar13 * '\x02' & 0x1fU);
          uVar16 = uVar16 + 1;
        } while ((long)(int)local_88c != uVar16);
      }
      Abc_Tt6IsopCover(~wVar2,~wVar2,uVar12,(int *)local_838,(int *)&local_88c);
      uVar14 = (ulong)local_88c;
      if ((int)uVar16 < (int)local_88c) {
        uVar16 = uVar16 & 0xffffffff;
        do {
          local_838[uVar16] = local_838[uVar16] | 2 << ((char)uVar13 * '\x02' & 0x1fU);
          uVar16 = uVar16 + 1;
        } while (uVar14 != uVar16);
      }
      if (0x40 < (int)local_88c) goto LAB_00770420;
    }
    else {
      pVVar1 = local_858->vTtMem;
      if ((long)pVVar1->nEntries <= (long)uVar13) goto LAB_00770401;
      uVar12 = Abc_Tt8Cnf(pVVar1->ppPages[uVar12 >> ((byte)pVVar1->LogPageSze & 0x1f)] +
                          (long)(int)(pVVar1->PageMask & uVar12) * (long)pVVar1->nEntrySize,uVar12,
                          (int *)local_838);
      uVar14 = (ulong)uVar12;
    }
    Entry = (int)uVar14;
    iVar9 = Entry;
    if (0 < Entry) {
      uVar10 = 0;
      uVar16 = uVar14;
      do {
        if (uVar13 == 1) {
          uVar16 = (ulong)(((int)uVar16 + 1) - (uint)((local_838[uVar10] & 3) == 0));
        }
        iVar9 = (int)uVar16;
        uVar10 = uVar10 + 1;
      } while (uVar14 != uVar10);
    }
    if (uVar13 == uVar17) goto LAB_007703e2;
    *(int *)((long)local_888 + uVar13 * 4) = iVar9;
    if ((long)p_00->nSize <= (long)uVar13) goto LAB_007703e2;
    p_00->pArray[uVar13] = p_00->nSize;
    Vec_IntPush(p_00,Entry);
    if (0 < Entry) {
      uVar16 = 0;
      do {
        Vec_IntPush(p_00,local_838[uVar16]);
        uVar16 = uVar16 + 1;
      } while (uVar14 != uVar16);
    }
    bVar19 = uVar13 == 0;
    uVar13 = uVar13 + 1;
  } while (bVar19);
  pVVar3 = local_858->pGia->vCos;
  *local_868 = local_858->pGia->vCis->nSize + 1 + pVVar3->nSize;
  *local_870 = pVVar3->nSize * 2 + 1;
  *local_878 = pVVar3->nSize * 4 + 1;
  pGVar7 = local_858->pGia;
  if (0 < pGVar7->nObjs) {
    lVar18 = 0;
    pMVar15 = local_858;
    do {
      if ((~*(uint *)(pGVar7->pObjs + lVar18) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(pGVar7->pObjs + lVar18)) {
        if (0xffff < *(uint *)&pMVar15->pLfObjs[lVar18].field_0xc) {
          uVar12 = pMVar15->pLfObjs[lVar18].iCutSet;
          uVar8 = (int)uVar12 >> 0x10;
          if (((int)uVar8 < 0) || ((pMVar15->vPages).nSize <= (int)uVar8)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar4 = (pMVar15->vPages).pArray[uVar8];
          uVar14 = (ulong)(uVar12 & 0xffff);
          uVar12 = *(uint *)((long)pvVar4 + uVar14 * 4 + 4);
          uVar8 = uVar12 >> 6;
          uVar13 = (ulong)uVar8;
          iVar9 = p_00->nSize;
          if (iVar9 <= (int)uVar8) {
LAB_0077043f:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar6 = p_00->pArray;
          if (piVar6[uVar13] == -1) {
            local_87c = iVar9;
            local_850 = uVar14;
            local_848 = pvVar4;
            local_840 = piVar6;
            if (pMVar15->pPars->nLutSize < 7) {
              pVVar1 = pMVar15->vTtMem;
              if (pVVar1->nEntries <= (int)uVar8) {
LAB_00770401:
                __assert_fail("i >= 0 && i < p->nEntries",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                              ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
              }
              wVar2 = pVVar1->ppPages[uVar8 >> ((byte)pVVar1->LogPageSze & 0x1f)]
                      [(ulong)(pVVar1->PageMask & uVar8) * (long)pVVar1->nEntrySize];
              uVar12 = uVar12 & 0x1f;
              local_88c = 0;
              Abc_Tt6IsopCover(wVar2,wVar2,uVar12,(int *)local_838,(int *)&local_88c);
              if ((long)(int)local_88c < 1) {
                uVar14 = 0;
              }
              else {
                uVar14 = 0;
                do {
                  local_838[uVar14] = local_838[uVar14] | 1 << ((char)uVar12 * '\x02' & 0x1fU);
                  uVar14 = uVar14 + 1;
                } while ((long)(int)local_88c != uVar14);
              }
              Abc_Tt6IsopCover(~wVar2,~wVar2,uVar12,(int *)local_838,(int *)&local_88c);
              if ((int)uVar14 < (int)local_88c) {
                uVar14 = uVar14 & 0xffffffff;
                do {
                  local_838[uVar14] = local_838[uVar14] | 2 << ((char)uVar12 * '\x02' & 0x1fU);
                  uVar14 = uVar14 + 1;
                } while (local_88c != uVar14);
              }
              pMVar15 = local_858;
              uVar12 = local_88c;
              if (0x40 < (int)local_88c) {
LAB_00770420:
                __assert_fail("nCubes <= 64",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                              ,0xa07,"int Abc_Tt6Cnf(word, int, int *)");
              }
            }
            else {
              pVVar1 = pMVar15->vTtMem;
              if (pVVar1->nEntries <= (int)uVar8) goto LAB_00770401;
              uVar12 = Abc_Tt8Cnf(pVVar1->ppPages[uVar8 >> ((byte)pVVar1->LogPageSze & 0x1f)] +
                                  (ulong)(pVVar1->PageMask & uVar8) * (long)pVVar1->nEntrySize,
                                  uVar12 & 0x1f,(int *)local_838);
            }
            if ((pMVar15->vCnfSizes).nSize <= (int)uVar8) goto LAB_0077043f;
            if (uVar12 != (pMVar15->vCnfSizes).pArray[uVar13]) {
              __assert_fail("nCubes == Vec_IntEntry(&p->vCnfSizes, iFunc)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                            ,0x134,"Vec_Int_t *Mf_ManDeriveCnfs(Mf_Man_t *, int *, int *, int *)");
            }
            uVar5 = uVar12;
            if (0 < (int)uVar12) {
              uVar11 = *(uint *)((long)local_848 + local_850 * 4 + 4) & 0x1f;
              uVar14 = 0;
              do {
                if (uVar11 != 0) {
                  iVar9 = 0;
                  do {
                    uVar5 = (uVar5 + 1) -
                            (uint)(((int)local_838[uVar14] >> ((byte)iVar9 & 0x1f) & 3U) == 0);
                    iVar9 = iVar9 + 2;
                  } while (uVar11 * 2 != iVar9);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar12);
            }
            if ((int)local_860 <= (int)uVar8) {
LAB_007703e2:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(uint *)((long)local_888 + (ulong)(uVar8 * 4)) = uVar5;
            *(int *)((long)local_840 + (ulong)(uVar8 * 4)) = local_87c;
            Vec_IntPush(p_00,uVar12);
            if (0 < (int)uVar12) {
              uVar14 = 0;
              do {
                Vec_IntPush(p_00,local_838[uVar14]);
                uVar14 = uVar14 + 1;
              } while (uVar12 != uVar14);
            }
          }
          *local_868 = *local_868 + 1;
          if ((pMVar15->vCnfSizes).nSize <= (int)uVar8) goto LAB_0077043f;
          *local_870 = *local_870 + (pMVar15->vCnfSizes).pArray[uVar13];
          if ((int)local_860 <= (int)uVar8) goto LAB_0077043f;
          *local_878 = *local_878 + *(int *)((long)local_888 + uVar13 * 4);
        }
      }
      lVar18 = lVar18 + 1;
      pGVar7 = pMVar15->pGia;
    } while (lVar18 < pGVar7->nObjs);
  }
  if (local_888 != (void *)0x0) {
    free(local_888);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Mf_ManDeriveCnfs( Mf_Man_t * p, int * pnVars, int * pnClas, int * pnLits )
{
    int i, k, iFunc, nCubes, nLits, * pCut, pCnf[512];
    Vec_Int_t * vLits = Vec_IntStart( Vec_IntSize(&p->vCnfSizes) );
    Vec_Int_t * vCnfs = Vec_IntAlloc( 3 * Vec_IntSize(&p->vCnfSizes) );
    Vec_IntFill( vCnfs, Vec_IntSize(&p->vCnfSizes), -1 );
    assert( p->pPars->nLutSize <= 8 );
    // constant/buffer
    for ( iFunc = 0; iFunc < 2; iFunc++ )
    {
        if ( p->pPars->nLutSize <= 6 )
            nCubes = Abc_Tt6Cnf( *Vec_MemReadEntry(p->vTtMem, iFunc), iFunc, pCnf );
        else
            nCubes = Abc_Tt8Cnf( Vec_MemReadEntry(p->vTtMem, iFunc), iFunc, pCnf );
        nLits = Mf_ManCountLits( pCnf, nCubes, iFunc );
        Vec_IntWriteEntry( vLits, iFunc, nLits );
        Vec_IntWriteEntry( vCnfs, iFunc, Vec_IntSize(vCnfs) );
        Vec_IntPush( vCnfs, nCubes );
        for ( k = 0; k < nCubes; k++ )
            Vec_IntPush( vCnfs, pCnf[k] );
    }
    // other functions
    *pnVars = 1 + Gia_ManCiNum(p->pGia) + Gia_ManCoNum(p->pGia);
    *pnClas = 1 + 2 * Gia_ManCoNum(p->pGia);
    *pnLits = 1 + 4 * Gia_ManCoNum(p->pGia);
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        //Mf_CutPrintOne( pCut );
        iFunc = Abc_Lit2Var( Mf_CutFunc(pCut) );
        if ( Vec_IntEntry(vCnfs, iFunc) == -1 )
        {
            if ( p->pPars->nLutSize <= 6 )
                nCubes = Abc_Tt6Cnf( *Vec_MemReadEntry(p->vTtMem, iFunc), Mf_CutSize(pCut), pCnf );
            else
                nCubes = Abc_Tt8Cnf( Vec_MemReadEntry(p->vTtMem, iFunc), Mf_CutSize(pCut), pCnf );
            assert( nCubes == Vec_IntEntry(&p->vCnfSizes, iFunc) );
            nLits = Mf_ManCountLits( pCnf, nCubes, Mf_CutSize(pCut) );
            // save CNF
            Vec_IntWriteEntry( vLits, iFunc, nLits );
            Vec_IntWriteEntry( vCnfs, iFunc, Vec_IntSize(vCnfs) );
            Vec_IntPush( vCnfs, nCubes );
            for ( k = 0; k < nCubes; k++ )
                Vec_IntPush( vCnfs, pCnf[k] );
        }
        *pnVars += 1;
        *pnClas += Vec_IntEntry(&p->vCnfSizes, iFunc);
        *pnLits += Vec_IntEntry(vLits, iFunc);
    }
    Vec_IntFree( vLits );
    return vCnfs;
}